

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O3

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>_>_>
          *fadexpr)

{
  double dVar1;
  uint uVar2;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>
  *pFVar3;
  FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *pFVar4;
  bool bVar5;
  uint uVar6;
  double *pdVar7;
  ulong uVar8;
  value_type vVar9;
  value_type vVar10;
  
  uVar6 = FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>
          ::size(&((fadexpr->fadexpr_).right_)->fadexpr_);
  uVar2 = (this->dx_).num_elts;
  if (uVar6 == uVar2) {
    if (uVar6 == 0) goto LAB_00f28f20;
    pdVar7 = (this->dx_).ptr_to_data;
  }
  else {
    if (uVar6 == 0) {
      if (uVar2 != 0) {
        pdVar7 = (this->dx_).ptr_to_data;
        if (pdVar7 != (double *)0x0) {
          operator_delete__(pdVar7);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      goto LAB_00f28f20;
    }
    if (uVar2 != 0) {
      pdVar7 = (this->dx_).ptr_to_data;
      if (pdVar7 != (double *)0x0) {
        operator_delete__(pdVar7);
      }
      (this->dx_).ptr_to_data = (double *)0x0;
    }
    (this->dx_).num_elts = uVar6;
    uVar8 = 0xffffffffffffffff;
    if (-1 < (int)uVar6) {
      uVar8 = (ulong)uVar6 << 3;
    }
    pdVar7 = (double *)operator_new__(uVar8);
    (this->dx_).ptr_to_data = pdVar7;
  }
  pFVar3 = (fadexpr->fadexpr_).right_;
  bVar5 = FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>
          ::hasFastAccess(&((pFVar3->fadexpr_).left_)->fadexpr_);
  if ((bVar5) && ((((((pFVar3->fadexpr_).right_)->fadexpr_).right_)->dx_).num_elts != 0)) {
    if (0 < (int)uVar6) {
      uVar8 = 0;
      do {
        vVar9 = FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>
                ::fastAccessDx(&((fadexpr->fadexpr_).right_)->fadexpr_,(int)uVar8);
        pdVar7[uVar8] = vVar9 * (fadexpr->fadexpr_).left_.constant_;
        uVar8 = uVar8 + 1;
      } while (uVar6 != uVar8);
    }
  }
  else if (0 < (int)uVar6) {
    uVar8 = 0;
    do {
      vVar9 = FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>
              ::dx(&((fadexpr->fadexpr_).right_)->fadexpr_,(int)uVar8);
      pdVar7[uVar8] = vVar9 * (fadexpr->fadexpr_).left_.constant_;
      uVar8 = uVar8 + 1;
    } while (uVar6 != uVar8);
  }
LAB_00f28f20:
  dVar1 = (fadexpr->fadexpr_).left_.constant_;
  pFVar3 = (fadexpr->fadexpr_).right_;
  vVar10 = FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>
           ::val(&((pFVar3->fadexpr_).left_)->fadexpr_);
  pFVar4 = (pFVar3->fadexpr_).right_;
  this->val_ = ((pFVar4->fadexpr_).left_.constant_ + ((pFVar4->fadexpr_).right_)->val_) * vVar10 *
               dVar1;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}